

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t rar5_cleanup(archive_read *a)

{
  rar5 *rar;
  
  rar = (rar5 *)a->format->data;
  free((rar->cstate).window_buf);
  free((rar->cstate).filtered_buf);
  free((rar->vol).push_buf);
  free_filters(rar);
  free((rar->cstate).filters.arr);
  free(rar);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int rar5_cleanup(struct archive_read *a) {
	struct rar5* rar = get_context(a);

	free(rar->cstate.window_buf);
	free(rar->cstate.filtered_buf);

	free(rar->vol.push_buf);

	free_filters(rar);
	cdeque_free(&rar->cstate.filters);

	free(rar);
	a->format->data = NULL;

	return ARCHIVE_OK;
}